

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_init.c
# Opt level: O0

void lj_init_cpuflags(void)

{
  int iVar1;
  undefined1 local_48 [4];
  uint local_44;
  uint32_t xfeatures [4];
  uint32_t features [4];
  uint32_t vendor [4];
  uint32_t local_c;
  uint32_t flags;
  
  local_c = 0;
  iVar1 = lj_vm_cpuid(0,features + 2);
  if (((iVar1 != 0) && (iVar1 = lj_vm_cpuid(1,xfeatures + 2), iVar1 != 0)) &&
     (local_c = (features[0] >> 0x14 & 1) << 7 |
                (features[0] >> 0x13 & 1) << 5 | (features[0] & 1) << 4, 6 < features[2])) {
    lj_vm_cpuid(7,local_48);
    local_c = (local_44 >> 8 & 1) << 6 | local_c;
  }
  str_hash_init(local_c);
  return;
}

Assistant:

LJ_INITIALIZER(lj_init_cpuflags)
{
  uint32_t flags = 0;
#if LJ_TARGET_X86ORX64

  uint32_t vendor[4];
  uint32_t features[4];
  if (lj_vm_cpuid(0, vendor) && lj_vm_cpuid(1, features)) {
    flags |= ((features[2] >> 0)&1) * JIT_F_SSE3;
    flags |= ((features[2] >> 19)&1) * JIT_F_SSE4_1;
    flags |= ((features[2] >> 20)&1) * JIT_F_SSE4_2;
    if (vendor[0] >= 7) {
      uint32_t xfeatures[4];
      lj_vm_cpuid(7, xfeatures);
      flags |= ((xfeatures[1] >> 8)&1) * JIT_F_BMI2;
    }
  }

#endif

  /* The reason why we initialized early: select our string hash functions.  */
  str_hash_init (flags);
}